

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

int __thiscall
cmCommandArgumentParserHelper::ParseString(cmCommandArgumentParserHelper *this,char *str,int verb)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  yyscan_t yyscanner;
  
  if (str == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    this->Verbose = verb;
    std::__cxx11::string::assign((char *)&this->InputBuffer);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    (this->Result)._M_string_length = 0;
    *(this->Result)._M_dataplus._M_p = '\0';
    cmCommandArgument_yylex_init(&yyscanner);
    cmCommandArgument_yyset_extra((cmListFileLexer *)this,yyscanner);
    cmCommandArgument_SetupEscapes(yyscanner,this->NoEscapeMode);
    iVar1 = cmCommandArgument_yyparse(yyscanner);
    cmCommandArgument_yylex_destroy(yyscanner);
    iVar3 = 0;
    if (iVar1 == 0) {
      CleanupParser(this);
      iVar3 = 1;
      if (this->Verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar2 = std::operator<<(poVar2,str);
        poVar2 = std::operator<<(poVar2,"] produced: [");
        poVar2 = std::operator<<(poVar2,(string *)&this->Result);
        poVar2 = std::operator<<(poVar2,"]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

int cmCommandArgumentParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result.clear();

  yyscan_t yyscanner;
  cmCommandArgument_yylex_init(&yyscanner);
  cmCommandArgument_yyset_extra(this, yyscanner);
  cmCommandArgument_SetupEscapes(yyscanner, this->NoEscapeMode);
  int res = cmCommandArgument_yyparse(yyscanner);
  cmCommandArgument_yylex_destroy(yyscanner);
  if (res != 0) {
    return 0;
  }

  this->CleanupParser();

  if (Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}